

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

common_chat_params *
common_chat_templates_apply(common_chat_templates *tmpls,common_chat_templates_inputs *inputs)

{
  long in_RDX;
  long in_RSI;
  common_chat_params *in_RDI;
  common_chat_templates_inputs *in_stack_00000140;
  common_chat_templates *in_stack_00000148;
  common_chat_templates_inputs *in_stack_00000250;
  common_chat_templates *in_stack_00000258;
  
  if (in_RSI == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/chat.cpp"
               ,0x6c5,"GGML_ASSERT(%s) failed","tmpls != nullptr");
  }
  if ((*(byte *)(in_RDX + 0x59) & 1) == 0) {
    common_chat_templates_apply_legacy(in_stack_00000258,in_stack_00000250);
  }
  else {
    common_chat_templates_apply_jinja(in_stack_00000148,in_stack_00000140);
  }
  return in_RDI;
}

Assistant:

common_chat_params common_chat_templates_apply(
    const struct common_chat_templates * tmpls,
    const struct common_chat_templates_inputs & inputs)
{
    GGML_ASSERT(tmpls != nullptr);
    return inputs.use_jinja
        ? common_chat_templates_apply_jinja(tmpls, inputs)
        : common_chat_templates_apply_legacy(tmpls, inputs);
}